

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

double ImPlot::PlotHistogram2D<long_long>
                 (char *label_id,longlong *xs,longlong *ys,int count,int x_bins,int y_bins,
                 bool density,ImPlotLimits range,bool outliers)

{
  TransformerLinLin transformer;
  long lVar1;
  double *pdVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  ImPlotContext *pIVar5;
  int rows;
  int cols;
  bool bVar6;
  int iVar7;
  long lVar8;
  double *__dest;
  ImDrawList *DrawList;
  long lVar9;
  ImPlotRange *pIVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double scale_max;
  double dVar21;
  double dVar22;
  int y_bins_local;
  int x_bins_local;
  double height;
  double width;
  char *local_58;
  ImPlotPoint local_50;
  ImPlotPoint local_40;
  
  uVar18 = 0;
  uVar19 = 0;
  if ((y_bins == 0 || x_bins == 0) || count < 1) goto LAB_00249aec;
  if ((((range.X.Min == 0.0) && (!NAN(range.X.Min))) && (range.X.Max == 0.0)) && (!NAN(range.X.Max))
     ) {
    lVar8 = *xs;
    lVar9 = lVar8;
    if (1 < count) {
      uVar11 = 1;
      do {
        lVar1 = xs[uVar11];
        if (lVar1 < lVar9) {
          lVar9 = lVar1;
        }
        if (lVar8 < lVar1) {
          lVar8 = lVar1;
        }
        uVar11 = uVar11 + 1;
      } while ((uint)count != uVar11);
    }
    range.X.Min = (double)lVar9;
    range.X.Max = (double)lVar8;
  }
  if (((range.Y.Min == 0.0) && (!NAN(range.Y.Min))) && ((range.Y.Max == 0.0 && (!NAN(range.Y.Max))))
     ) {
    lVar8 = *ys;
    lVar9 = lVar8;
    if (1 < count) {
      uVar11 = 1;
      do {
        lVar1 = ys[uVar11];
        if (lVar1 < lVar9) {
          lVar9 = lVar1;
        }
        if (lVar8 < lVar1) {
          lVar8 = lVar1;
        }
        uVar11 = uVar11 + 1;
      } while ((uint)count != uVar11);
    }
    range.Y.Min = (double)lVar9;
    range.Y.Max = (double)lVar8;
  }
  y_bins_local = y_bins;
  x_bins_local = x_bins;
  local_58 = label_id;
  if (x_bins < 0) {
    CalculateBins<long_long>(xs,count,x_bins,&range.X,&x_bins_local,&width);
  }
  else {
    width = (range.X.Max - range.X.Min) / (double)x_bins;
  }
  if (y_bins < 0) {
    CalculateBins<long_long>(ys,count,y_bins,&range.Y,&y_bins_local,&height);
  }
  else {
    height = (range.Y.Max - range.Y.Min) / (double)y_bins;
  }
  cols = x_bins_local;
  rows = y_bins_local;
  pIVar4 = GImPlot;
  uVar17 = y_bins_local * x_bins_local;
  iVar7 = (GImPlot->Temp1).Capacity;
  if (iVar7 < (int)uVar17) {
    if (iVar7 == 0) {
      uVar16 = 8;
    }
    else {
      uVar16 = iVar7 / 2 + iVar7;
    }
    if ((int)uVar16 <= (int)uVar17) {
      uVar16 = uVar17;
    }
    if (iVar7 < (int)uVar16) {
      __dest = (double *)ImGui::MemAlloc((long)(int)uVar16 << 3);
      pdVar2 = (pIVar4->Temp1).Data;
      if (pdVar2 != (double *)0x0) {
        memcpy(__dest,pdVar2,(long)(pIVar4->Temp1).Size << 3);
        ImGui::MemFree((pIVar4->Temp1).Data);
      }
      (pIVar4->Temp1).Data = __dest;
      (pIVar4->Temp1).Capacity = uVar16;
    }
  }
  (pIVar4->Temp1).Size = uVar17;
  if (0 < (int)uVar17) {
    uVar11 = 0;
    do {
      if ((long)(pIVar4->Temp1).Size <= (long)uVar11) goto LAB_00249afb;
      (pIVar4->Temp1).Data[uVar11] = 0.0;
      uVar11 = uVar11 + 1;
    } while (uVar17 != uVar11);
  }
  if (count < 1) {
    iVar7 = 0;
    scale_max = 0.0;
  }
  else {
    uVar11 = 0;
    iVar7 = 0;
    dVar22 = 0.0;
    do {
      dVar21 = (double)xs[uVar11];
      scale_max = dVar22;
      if (((range.X.Min <= dVar21) && (dVar21 <= range.X.Max)) &&
         ((dVar20 = (double)ys[uVar11], range.Y.Min <= dVar20 && (dVar20 <= range.Y.Max)))) {
        iVar14 = (int)((dVar21 - range.X.Min) / width);
        iVar15 = iVar14;
        if (cols + -1 <= iVar14) {
          iVar15 = cols + -1;
        }
        iVar13 = 0;
        if (-1 < iVar14) {
          iVar13 = iVar15;
        }
        iVar14 = (int)((dVar20 - range.Y.Min) / height);
        iVar15 = iVar14;
        if (rows + -1 <= iVar14) {
          iVar15 = rows + -1;
        }
        iVar12 = 0;
        if (-1 < iVar14) {
          iVar12 = iVar15;
        }
        uVar16 = iVar12 * cols + iVar13;
        if (((int)uVar16 < 0) || ((pIVar4->Temp1).Size <= (int)uVar16)) goto LAB_00249afb;
        pdVar2 = (pIVar4->Temp1).Data;
        scale_max = pdVar2[uVar16] + 1.0;
        pdVar2[uVar16] = scale_max;
        if ((pIVar4->Temp1).Size <= (int)uVar16) goto LAB_00249afb;
        if (scale_max <= dVar22) {
          scale_max = dVar22;
        }
        iVar7 = iVar7 + 1;
      }
      uVar11 = uVar11 + 1;
      dVar22 = scale_max;
    } while ((uint)count != uVar11);
  }
  if (density) {
    if (outliers) {
      iVar7 = count;
    }
    dVar22 = 1.0 / ((double)iVar7 * width * height);
    if (0 < (int)uVar17) {
      uVar11 = 0;
      do {
        if ((long)(pIVar4->Temp1).Size <= (long)uVar11) {
LAB_00249afb:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,"T &ImVector<double>::operator[](int) [T = double]");
        }
        pdVar2 = (pIVar4->Temp1).Data;
        pdVar2[uVar11] = pdVar2[uVar11] * dVar22;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
    }
    scale_max = scale_max * dVar22;
  }
  bVar6 = BeginItem(local_58,-1);
  pIVar5 = GImPlot;
  if (bVar6) {
    if (GImPlot->FitThisFrame == true) {
      uVar18 = SUB84(range.Y.Min,0);
      uVar19 = (undefined4)((ulong)range.Y.Min >> 0x20);
      pIVar3 = GImPlot->CurrentPlot;
      iVar7 = pIVar3->CurrentYAxis;
      uVar17 = (pIVar3->XAxis).Flags;
      if ((uVar17 >> 10 & 1) == 0) {
        if ((ulong)ABS(range.X.Min) < 0x7ff0000000000000) {
LAB_0024973d:
          if ((0.0 < range.X.Min) || ((uVar17 & 0x20) == 0)) {
            dVar22 = (GImPlot->ExtentsX).Min;
            dVar21 = range.X.Min;
            if (dVar22 <= range.X.Min) {
              dVar21 = dVar22;
            }
            (GImPlot->ExtentsX).Min = dVar21;
            dVar22 = (pIVar5->ExtentsX).Max;
            dVar21 = range.X.Min;
            if (range.X.Min <= dVar22) {
              dVar21 = dVar22;
            }
            (pIVar5->ExtentsX).Max = dVar21;
          }
        }
      }
      else if ((((ulong)ABS(range.X.Min) < 0x7ff0000000000000) &&
               (pIVar3->YAxis[iVar7].Range.Min <= range.Y.Min)) &&
              (range.Y.Min <= pIVar3->YAxis[iVar7].Range.Max)) goto LAB_0024973d;
      pIVar10 = pIVar5->ExtentsY + iVar7;
      uVar16 = pIVar3->YAxis[iVar7].Flags;
      if ((uVar16 >> 10 & 1) == 0) {
        if ((ulong)ABS(range.Y.Min) < 0x7ff0000000000000) {
LAB_002497bf:
          if ((0.0 < range.Y.Min) || ((uVar16 & 0x20) == 0)) {
            dVar22 = range.Y.Min;
            if (pIVar10->Min <= range.Y.Min) {
              dVar22 = pIVar10->Min;
            }
            pIVar10->Min = dVar22;
            dVar22 = pIVar5->ExtentsY[iVar7].Max;
            if (range.Y.Min <= dVar22) {
              uVar18 = SUB84(dVar22,0);
              uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
            }
            pIVar5->ExtentsY[iVar7].Max = (double)CONCAT44(uVar19,uVar18);
          }
        }
      }
      else if ((((ulong)ABS(range.Y.Min) < 0x7ff0000000000000) &&
               ((pIVar3->XAxis).Range.Min <= range.X.Min)) &&
              (range.X.Min <= (pIVar3->XAxis).Range.Max)) goto LAB_002497bf;
      uVar18 = SUB84(range.Y.Max,0);
      uVar19 = (undefined4)((ulong)range.Y.Max >> 0x20);
      if ((uVar17 >> 10 & 1) == 0) {
        if ((ulong)ABS(range.X.Max) < 0x7ff0000000000000) {
LAB_0024983a:
          if (((uVar17 & 0x20) == 0) || (0.0 < range.X.Max)) {
            dVar22 = (pIVar5->ExtentsX).Min;
            dVar21 = range.X.Max;
            if (dVar22 <= range.X.Max) {
              dVar21 = dVar22;
            }
            (pIVar5->ExtentsX).Min = dVar21;
            dVar22 = (pIVar5->ExtentsX).Max;
            dVar21 = range.X.Max;
            if (range.X.Max <= dVar22) {
              dVar21 = dVar22;
            }
            (pIVar5->ExtentsX).Max = dVar21;
          }
        }
      }
      else if ((((ulong)ABS(range.X.Max) < 0x7ff0000000000000) &&
               (pIVar3->YAxis[iVar7].Range.Min <= range.Y.Max)) &&
              (range.Y.Max <= pIVar3->YAxis[iVar7].Range.Max)) goto LAB_0024983a;
      if ((uVar16 >> 10 & 1) == 0) {
        if ((ulong)ABS(range.Y.Max) < 0x7ff0000000000000) {
LAB_002498be:
          if (((uVar16 & 0x20) == 0) || (0.0 < range.Y.Max)) {
            dVar22 = range.Y.Max;
            if (pIVar10->Min <= range.Y.Max) {
              dVar22 = pIVar10->Min;
            }
            pIVar10->Min = dVar22;
            dVar22 = pIVar5->ExtentsY[iVar7].Max;
            if (range.Y.Max <= dVar22) {
              uVar18 = SUB84(dVar22,0);
              uVar19 = (undefined4)((ulong)dVar22 >> 0x20);
            }
            pIVar5->ExtentsY[iVar7].Max = (double)CONCAT44(uVar19,uVar18);
          }
        }
      }
      else if ((((ulong)ABS(range.Y.Max) < 0x7ff0000000000000) &&
               ((pIVar3->XAxis).Range.Min <= range.X.Max)) &&
              (range.X.Max <= (pIVar3->XAxis).Range.Max)) goto LAB_002498be;
    }
    DrawList = GetPlotDrawList();
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      local_40.x = range.X.Min;
      local_40.y = range.Y.Min;
      local_50.x = range.X.Max;
      local_50.y = range.Y.Max;
      RenderHeatmap<double,ImPlot::TransformerLinLin>
                (transformer,DrawList,(pIVar4->Temp1).Data,rows,cols,0.0,scale_max,(char *)0x0,
                 &local_40,&local_50,false);
      break;
    case 1:
      local_40.x = range.X.Min;
      local_40.y = range.Y.Min;
      local_50.x = range.X.Max;
      local_50.y = range.Y.Max;
      RenderHeatmap<double,ImPlot::TransformerLogLin>
                ((TransformerLogLin)transformer.YAxis,DrawList,(pIVar4->Temp1).Data,rows,cols,0.0,
                 scale_max,(char *)0x0,&local_40,&local_50,false);
      break;
    case 2:
      local_40.x = range.X.Min;
      local_40.y = range.Y.Min;
      local_50.x = range.X.Max;
      local_50.y = range.Y.Max;
      RenderHeatmap<double,ImPlot::TransformerLinLog>
                ((TransformerLinLog)transformer.YAxis,DrawList,(pIVar4->Temp1).Data,rows,cols,0.0,
                 scale_max,(char *)0x0,&local_40,&local_50,false);
      break;
    case 3:
      local_40.x = range.X.Min;
      local_40.y = range.Y.Min;
      local_50.x = range.X.Max;
      local_50.y = range.Y.Max;
      RenderHeatmap<double,ImPlot::TransformerLogLog>
                ((TransformerLogLog)transformer.YAxis,DrawList,(pIVar4->Temp1).Data,rows,cols,0.0,
                 scale_max,(char *)0x0,&local_40,&local_50,false);
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  uVar18 = SUB84(scale_max,0);
  uVar19 = (undefined4)((ulong)scale_max >> 0x20);
LAB_00249aec:
  return (double)CONCAT44(uVar19,uVar18);
}

Assistant:

double PlotHistogram2D(const char* label_id, const T* xs, const T* ys, int count, int x_bins, int y_bins, bool density, ImPlotLimits range, bool outliers) {

    if (count <= 0 || x_bins == 0 || y_bins == 0)
        return 0;

    if (range.X.Min == 0 && range.X.Max == 0) {
        T Min, Max;
        ImMinMaxArray(xs, count, &Min, &Max);
        range.X.Min = (double)Min;
        range.X.Max = (double)Max;
    }
    if (range.Y.Min == 0 && range.Y.Max == 0) {
        T Min, Max;
        ImMinMaxArray(ys, count, &Min, &Max);
        range.Y.Min = (double)Min;
        range.Y.Max = (double)Max;
    }

    double width, height;
    if (x_bins < 0)
        CalculateBins(xs, count, x_bins, range.X, x_bins, width);
    else
        width = range.X.Size() / x_bins;
    if (y_bins < 0)
        CalculateBins(ys, count, y_bins, range.Y, y_bins, height);
    else
        height = range.Y.Size() / y_bins;

    const int bins = x_bins * y_bins;

    ImVector<double>& bin_counts = GImPlot->Temp1;
    bin_counts.resize(bins);

    for (int b = 0; b < bins; ++b)
        bin_counts[b] = 0;

    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        if (range.Contains((double)xs[i], (double)ys[i])) {
            const int xb = ImClamp( (int)((double)(xs[i] - range.X.Min) / width)  , 0, x_bins - 1);
            const int yb = ImClamp( (int)((double)(ys[i] - range.Y.Min) / height) , 0, y_bins - 1);
            const int b  = yb * x_bins + xb;
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
    }
    if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width * height);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }

    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(range.Min());
            FitPoint(range.Max());
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
        }
        EndItem();
    }
    return max_count;
}